

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O1

void __thiscall
cbt2DsegmentShape::calculateLocalInertia(cbt2DsegmentShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  fVar1 = (this->P2).m_floats[1] - *(float *)&this->field_0x48;
  auVar3 = ZEXT416((uint)((this->P2).m_floats[0] -
                         *(float *)&(this->super_cbtConvexInternalShape).field_0x44));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar3,auVar3);
  auVar2 = ZEXT416((uint)((this->P2).m_floats[2] - *(float *)&this->field_0x4c));
  auVar3 = vfmadd231ss_fma(auVar3,auVar2,auVar2);
  if (auVar3._0_4_ < 0.0) {
    fVar1 = sqrtf(auVar3._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    fVar1 = auVar3._0_4_;
  }
  fVar1 = fVar1 * 0.5 + 0.04;
  fVar1 = fVar1 + fVar1;
  fVar1 = fVar1 * fVar1;
  fVar1 = mass * 0.08333333 * (fVar1 + fVar1);
  inertia->m_floats[0] = fVar1;
  inertia->m_floats[1] = fVar1;
  inertia->m_floats[2] = fVar1;
  return;
}

Assistant:

void	cbt2DsegmentShape::calculateLocalInertia(cbtScalar mass,cbtVector3& inertia) const
{
	//***TO DO***
	//as an approximation, take the inertia of the box that bounds the barrell

	cbtTransform ident;
	ident.setIdentity();

    double hlen = 0.5*(P2-P1).length();

	cbtVector3 halfExtents;

	halfExtents.setValue((cbtScalar)(hlen), 
						 (cbtScalar)(hlen),
						 (cbtScalar)(hlen));

	cbtScalar margin = CONVEX_DISTANCE_MARGIN;

	cbtScalar lx=cbtScalar(2.)*(halfExtents[0]+margin);
	cbtScalar ly=cbtScalar(2.)*(halfExtents[1]+margin);
	cbtScalar lz=cbtScalar(2.)*(halfExtents[2]+margin);
	const cbtScalar x2 = lx*lx;
	const cbtScalar y2 = ly*ly;
	const cbtScalar z2 = lz*lz;
	const cbtScalar scaledmass = mass * cbtScalar(.08333333);

	inertia[0] = scaledmass * (y2+z2);
	inertia[1] = scaledmass * (x2+z2);
	inertia[2] = scaledmass * (x2+y2);
}